

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Resize
          (RepeatedField<unsigned_long> *this,int new_size,unsigned_long *value)

{
  Rep *pRVar1;
  unsigned_long uVar2;
  LogMessage *other;
  long lVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pRVar1 = this->rep_;
    uVar2 = *value;
    for (lVar3 = (long)this->current_size_ << 3; (long)new_size * 8 != lVar3; lVar3 = lVar3 + 8) {
      *(unsigned_long *)((long)pRVar1->elements + lVar3) = uVar2;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&rep_->elements[current_size_],
              &rep_->elements[new_size], value);
  }
  current_size_ = new_size;
}